

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O0

void libtorrent::heterogeneous_queue<libtorrent::alert>::move<libtorrent::dht_get_peers_reply_alert>
               (char *dst,char *src)

{
  dht_get_peers_reply_alert *rhs;
  char *src_local;
  char *dst_local;
  
  dht_get_peers_reply_alert::dht_get_peers_reply_alert
            ((dht_get_peers_reply_alert *)dst,(dht_get_peers_reply_alert *)src);
  dht_get_peers_reply_alert::~dht_get_peers_reply_alert((dht_get_peers_reply_alert *)src);
  return;
}

Assistant:

static void move(char* dst, char* src) noexcept
		{
			static_assert(std::is_nothrow_move_constructible<U>::value
				, "heterogeneous queue only supports noexcept move constructible types");
			static_assert(std::is_nothrow_destructible<U>::value
				, "heterogeneous queue only supports noexcept destructible types");
			U& rhs = *reinterpret_cast<U*>(src);

			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(dst) & (alignof(U) - 1)) == 0);

			new (dst) U(std::move(rhs));
			rhs.~U();
		}